

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# homomorphism_model.cc
# Opt level: O0

void __thiscall
gss::innards::HomomorphismModel::_build_distance3_graphs
          (HomomorphismModel *this,
          vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_> *graph_rows,
          uint size,uint *idx,bool pattern)

{
  uint uVar1;
  pointer pIVar2;
  int *in_RCX;
  uint in_EDX;
  vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_> *in_RSI;
  allocator<char> *in_RDI;
  byte in_R8B;
  uint w;
  value_type nc;
  uint c;
  value_type nv;
  uint v;
  SVOBitset *in_stack_fffffffffffffe48;
  SVOBitset *in_stack_fffffffffffffe50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  SVOBitset *in_stack_fffffffffffffe58;
  value_type *__x;
  uint in_stack_fffffffffffffe60;
  uint in_stack_fffffffffffffe64;
  reference in_stack_fffffffffffffe68;
  uint in_stack_fffffffffffffe70;
  char *in_stack_fffffffffffffe88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe90;
  uint local_14c;
  uint local_c0;
  uint local_28;
  
  for (local_28 = 0; local_28 < in_EDX; local_28 = local_28 + 1) {
    std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::operator[]
              (in_RSI,(ulong)(local_28 * *(int *)(in_RDI + 8)));
    SVOBitset::SVOBitset(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
    std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::operator[]
              (in_RSI,(ulong)(local_28 * *(int *)(in_RDI + 8) + *in_RCX));
    SVOBitset::operator|=
              ((SVOBitset *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
               in_stack_fffffffffffffe58);
    uVar1 = SVOBitset::find_first(in_stack_fffffffffffffe68);
    local_c0 = uVar1;
    while (local_c0 != 0xffffffff) {
      SVOBitset::reset((SVOBitset *)CONCAT44(uVar1,in_stack_fffffffffffffe70),
                       (int)((ulong)in_stack_fffffffffffffe68 >> 0x20));
      std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::operator[]
                (in_RSI,(ulong)(local_c0 * *(int *)(in_RDI + 8)));
      SVOBitset::SVOBitset(in_stack_fffffffffffffe50,in_stack_fffffffffffffe48);
      std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::operator[]
                (in_RSI,(ulong)(local_28 * *(int *)(in_RDI + 8) + *in_RCX));
      SVOBitset::operator|=
                ((SVOBitset *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                 in_stack_fffffffffffffe58);
      in_stack_fffffffffffffe70 = SVOBitset::find_first(in_stack_fffffffffffffe68);
      local_14c = in_stack_fffffffffffffe70;
      while (local_14c != 0xffffffff) {
        SVOBitset::reset((SVOBitset *)CONCAT44(uVar1,in_stack_fffffffffffffe70),
                         (int)((ulong)in_stack_fffffffffffffe68 >> 0x20));
        in_stack_fffffffffffffe68 =
             std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::
             operator[](in_RSI,(ulong)(local_14c * *(int *)(in_RDI + 8)));
        std::vector<gss::innards::SVOBitset,_std::allocator<gss::innards::SVOBitset>_>::operator[]
                  (in_RSI,(ulong)(local_28 * *(int *)(in_RDI + 8) + *in_RCX));
        SVOBitset::operator|=
                  ((SVOBitset *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                   in_stack_fffffffffffffe58);
        in_stack_fffffffffffffe64 = SVOBitset::find_first(in_stack_fffffffffffffe68);
        local_14c = in_stack_fffffffffffffe64;
      }
      SVOBitset::~SVOBitset(in_stack_fffffffffffffe50);
      in_stack_fffffffffffffe60 = SVOBitset::find_first(in_stack_fffffffffffffe68);
      local_c0 = in_stack_fffffffffffffe60;
    }
    SVOBitset::~SVOBitset(in_stack_fffffffffffffe50);
  }
  if ((in_R8B & 1) != 0) {
    pIVar2 = std::
             unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
             ::operator->((unique_ptr<gss::innards::HomomorphismModel::Imp,_std::default_delete<gss::innards::HomomorphismModel::Imp>_>
                           *)0x157dcf);
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &pIVar2->supplemental_graph_names;
    __x = (value_type *)&stack0xfffffffffffffe8f;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,in_RDI);
    std::__cxx11::
    list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),__x);
    std::__cxx11::string::~string(this_00);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe8f);
  }
  *in_RCX = *in_RCX + 1;
  return;
}

Assistant:

auto HomomorphismModel::_build_distance3_graphs(vector<SVOBitset> & graph_rows, unsigned size, unsigned & idx,
        bool pattern) -> void
{
    for (unsigned v = 0; v < size; ++v) {
        auto nv = graph_rows[v * max_graphs + 0];
        graph_rows[v * max_graphs + idx] |= nv;
        for (auto c = nv.find_first(); c != decltype(nv)::npos; c = nv.find_first()) {
            nv.reset(c);
            auto nc = graph_rows[c * max_graphs + 0];
            graph_rows[v * max_graphs + idx] |= nc;
            for (auto w = nc.find_first(); w != decltype(nc)::npos; w = nc.find_first()) {
                nc.reset(w);
                // v--c--w so v is within distance 3 of w's neighbours
                graph_rows[v * max_graphs + idx] |= graph_rows[w * max_graphs + 0];
            }
        }
    }

    if (pattern)
        _imp->supplemental_graph_names.push_back("distance3");
    ++idx;
}